

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.h
# Opt level: O0

void sentencepiece::ParseCommandLineFlags(char *usage,int *argc,char ***argv,bool remove_arg)

{
  int iVar1;
  char **ppcVar2;
  size_type sVar3;
  const_iterator __first;
  const_iterator __last;
  int *piVar4;
  char **argv_val;
  vector<char_*,_std::allocator<char_*>_> unused_args;
  string_view local_38;
  byte local_21;
  char ***pppcStack_20;
  bool remove_arg_local;
  char ***argv_local;
  int *argc_local;
  char *usage_local;
  
  local_21 = remove_arg;
  pppcStack_20 = argv;
  argv_local = (char ***)argc;
  argc_local = (int *)usage;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_38,**argv);
  absl::SetProgramUsageMessage(local_38);
  absl::ParseCommandLine((int)&argv_val,(char **)(ulong)*(uint *)argv_local);
  if ((local_21 & 1) != 0) {
    ppcVar2 = *pppcStack_20;
    iVar1 = *(int *)argv_local;
    sVar3 = std::vector<char_*,_std::allocator<char_*>_>::size
                      ((vector<char_*,_std::allocator<char_*>_> *)&argv_val);
    *pppcStack_20 = ppcVar2 + ((long)iVar1 - sVar3);
    __first = std::vector<char_*,_std::allocator<char_*>_>::begin
                        ((vector<char_*,_std::allocator<char_*>_> *)&argv_val);
    __last = std::vector<char_*,_std::allocator<char_*>_>::end
                       ((vector<char_*,_std::allocator<char_*>_> *)&argv_val);
    std::
    copy<__gnu_cxx::__normal_iterator<char*const*,std::vector<char*,std::allocator<char*>>>,char**>
              ((__normal_iterator<char_*const_*,_std::vector<char_*,_std::allocator<char_*>_>_>)
               __first._M_current,
               (__normal_iterator<char_*const_*,_std::vector<char_*,_std::allocator<char_*>_>_>)
               __last._M_current,ppcVar2 + ((long)iVar1 - sVar3));
    sVar3 = std::vector<char_*,_std::allocator<char_*>_>::size
                      ((vector<char_*,_std::allocator<char_*>_> *)&argv_val);
    *(int *)argv_local = (int)sVar3;
  }
  piVar4 = absl::GetFlag<int>((Flag<int> *)&FLAGS_minloglevel);
  sentencepiece::logging::SetMinLogLevel(*piVar4);
  std::vector<char_*,_std::allocator<char_*>_>::~vector
            ((vector<char_*,_std::allocator<char_*>_> *)&argv_val);
  return;
}

Assistant:

inline void ParseCommandLineFlags(const char *usage, int *argc, char ***argv,
                                  bool remove_arg = true) {
  absl::SetProgramUsageMessage(*argv[0]);
  const auto unused_args = absl::ParseCommandLine(*argc, *argv);

  if (remove_arg) {
    char **argv_val = *argv;
    *argv = argv_val = argv_val + *argc - unused_args.size();
    std::copy(unused_args.begin(), unused_args.end(), argv_val);
    *argc = static_cast<int>(unused_args.size());
  }

  logging::SetMinLogLevel(absl::GetFlag(FLAGS_minloglevel));
}